

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O2

void __thiscall btRigidBody::applyDamping(btRigidBody *this,btScalar timeStep)

{
  btVector3 *this_00;
  btVector3 *this_01;
  btScalar bVar1;
  btVector3 bVar2;
  btVector3 local_30;
  
  local_30.m_floats[0] = powf(1.0 - this->m_linearDamping,timeStep);
  this_00 = &this->m_linearVelocity;
  btVector3::operator*=(this_00,local_30.m_floats);
  local_30.m_floats[0] = powf(1.0 - this->m_angularDamping,timeStep);
  this_01 = &this->m_angularVelocity;
  btVector3::operator*=(this_01,local_30.m_floats);
  if (this->m_additionalDamping == true) {
    bVar1 = btVector3::length2(this_01);
    if (bVar1 < this->m_additionalAngularDampingThresholdSqr) {
      bVar1 = btVector3::length2(this_00);
      if (bVar1 < this->m_additionalLinearDampingThresholdSqr) {
        btVector3::operator*=(this_01,&this->m_additionalDampingFactor);
        btVector3::operator*=(this_00,&this->m_additionalDampingFactor);
      }
    }
    bVar1 = btVector3::length(this_00);
    if (bVar1 < this->m_linearDamping) {
      if (bVar1 <= 0.005) {
        this_00->m_floats[0] = 0.0;
        this_00->m_floats[1] = 0.0;
        (this->m_linearVelocity).m_floats[2] = 0.0;
        (this->m_linearVelocity).m_floats[3] = 0.0;
      }
      else {
        bVar2 = btVector3::normalized(this_00);
        local_30.m_floats[1] = bVar2.m_floats[1] * 0.005;
        local_30.m_floats[0] = bVar2.m_floats[0] * 0.005;
        local_30.m_floats[2] = bVar2.m_floats[2] * 0.005;
        local_30.m_floats[3] = 0.0;
        btVector3::operator-=(this_00,&local_30);
      }
    }
    bVar1 = btVector3::length(this_01);
    if (bVar1 < this->m_angularDamping) {
      if (bVar1 <= 0.005) {
        this_01->m_floats[0] = 0.0;
        this_01->m_floats[1] = 0.0;
        (this->m_angularVelocity).m_floats[2] = 0.0;
        (this->m_angularVelocity).m_floats[3] = 0.0;
      }
      else {
        bVar2 = btVector3::normalized(this_01);
        local_30.m_floats[1] = bVar2.m_floats[1] * 0.005;
        local_30.m_floats[0] = bVar2.m_floats[0] * 0.005;
        local_30.m_floats[2] = bVar2.m_floats[2] * 0.005;
        local_30.m_floats[3] = 0.0;
        btVector3::operator-=(this_01,&local_30);
      }
    }
  }
  return;
}

Assistant:

void			btRigidBody::applyDamping(btScalar timeStep)
{
	//On new damping: see discussion/issue report here: http://code.google.com/p/bullet/issues/detail?id=74
	//todo: do some performance comparisons (but other parts of the engine are probably bottleneck anyway

//#define USE_OLD_DAMPING_METHOD 1
#ifdef USE_OLD_DAMPING_METHOD
	m_linearVelocity *= GEN_clamped((btScalar(1.) - timeStep * m_linearDamping), (btScalar)btScalar(0.0), (btScalar)btScalar(1.0));
	m_angularVelocity *= GEN_clamped((btScalar(1.) - timeStep * m_angularDamping), (btScalar)btScalar(0.0), (btScalar)btScalar(1.0));
#else
	m_linearVelocity *= btPow(btScalar(1)-m_linearDamping, timeStep);
	m_angularVelocity *= btPow(btScalar(1)-m_angularDamping, timeStep);
#endif

	if (m_additionalDamping)
	{
		//Additional damping can help avoiding lowpass jitter motion, help stability for ragdolls etc.
		//Such damping is undesirable, so once the overall simulation quality of the rigid body dynamics system has improved, this should become obsolete
		if ((m_angularVelocity.length2() < m_additionalAngularDampingThresholdSqr) &&
			(m_linearVelocity.length2() < m_additionalLinearDampingThresholdSqr))
		{
			m_angularVelocity *= m_additionalDampingFactor;
			m_linearVelocity *= m_additionalDampingFactor;
		}
	

		btScalar speed = m_linearVelocity.length();
		if (speed < m_linearDamping)
		{
			btScalar dampVel = btScalar(0.005);
			if (speed > dampVel)
			{
				btVector3 dir = m_linearVelocity.normalized();
				m_linearVelocity -=  dir * dampVel;
			} else
			{
				m_linearVelocity.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
			}
		}

		btScalar angSpeed = m_angularVelocity.length();
		if (angSpeed < m_angularDamping)
		{
			btScalar angDampVel = btScalar(0.005);
			if (angSpeed > angDampVel)
			{
				btVector3 dir = m_angularVelocity.normalized();
				m_angularVelocity -=  dir * angDampVel;
			} else
			{
				m_angularVelocity.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
			}
		}
	}
}